

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLAttribute * __thiscall tinyxml2::XMLElement::CreateAttribute(XMLElement *this)

{
  XMLDocument *pXVar1;
  XMLAttribute *pXVar2;
  MemPoolT<80> *pMVar3;
  
  pXVar2 = (XMLAttribute *)MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
  pXVar2->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_00115980;
  (pXVar2->_name)._flags = 0;
  (pXVar2->_name)._start = (char *)0x0;
  (pXVar2->_name)._end = (char *)0x0;
  (pXVar2->_value)._flags = 0;
  (pXVar2->_value)._start = (char *)0x0;
  (pXVar2->_value)._end = (char *)0x0;
  pXVar2->_parseLineNum = 0;
  pXVar2->_next = (XMLAttribute *)0x0;
  pXVar2->_memPool = (MemPool *)0x0;
  pXVar1 = (this->super_XMLNode)._document;
  pMVar3 = &pXVar1->_attributePool;
  pXVar2->_memPool = &pMVar3->super_MemPool;
  (*(pXVar1->_attributePool).super_MemPool._vptr_MemPool[5])(pMVar3);
  return pXVar2;
}

Assistant:

XMLAttribute* XMLElement::CreateAttribute()
{
    TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
    XMLAttribute* attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
    TIXMLASSERT( attrib );
    attrib->_memPool = &_document->_attributePool;
    attrib->_memPool->SetTracked();
    return attrib;
}